

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O2

DreamPDF *
TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>
          (DreamPDF *__return_storage_ptr__,DreamMergedLikelyModel *likelihood_model,
          DreamPrior *prior)

{
  anon_class_64_2_a55f5f71 local_50;
  
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_50.likelihood_model,likelihood_model);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_50.prior,prior);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)__return_storage_ptr__,&local_50);
  posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)
  ::
  {lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)#1}
  ::~function((_lambda_std__vector<double,std::allocator<double>>const__std__vector<double,std::allocator<double>>___1_
               *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

DreamPDF posterior(DreamMergedLikelyModel likelihood_model,
          DreamPrior prior){
    return [=](const std::vector<double> &candidates, std::vector<double> &values)->void{
        likelihood_model(candidates, values);

        std::vector<double> prior_vals(values.size());
        prior(form, candidates, prior_vals);

        auto iv = values.begin();
        if (form == regform){
            for(auto p : prior_vals) *iv++ *= p;
        }else{
            for(auto p : prior_vals) *iv++ += p;
        }
    };
}